

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightredis.cpp
# Opt level: O2

int main(void)

{
  epoll_data_t *__addr;
  int __fd;
  undefined1 local_5f8 [8];
  reactor react;
  sockaddr_in servaddr;
  int epollfd;
  
  __fd = socket(2,1,0);
  if (__fd != -1) {
    __addr = &react.events[99].data;
    bzero(__addr,0x10);
    react.events[99].data.ptr = (void *)0x95260002;
    bind(__fd,(sockaddr *)__addr,0x10);
  }
  listen(__fd,0x400);
  reactor::reactor((reactor *)local_5f8,(int *)(servaddr.sin_zero + 4),__fd);
  servaddr.sin_zero[0] = 0xff;
  servaddr.sin_zero[1] = 0xff;
  servaddr.sin_zero[2] = 0xff;
  servaddr.sin_zero[3] = 0xff;
  reactor::reactor_listen((reactor *)local_5f8,(int *)servaddr.sin_zero);
  close(servaddr.sin_zero._4_4_);
  reactor::~reactor((reactor *)local_5f8);
  return 0;
}

Assistant:

int main(){
      int epollfd,listenfd;
      struct sockaddr_in servaddr;

      listenfd=socket(AF_INET,SOCK_STREAM,0);

      if(listenfd!=-1){
            bzero(&servaddr,sizeof(servaddr));
            servaddr.sin_family=AF_INET;
            servaddr.sin_port=htons(9877);
            servaddr.sin_addr.s_addr=htonl(INADDR_ANY);

            bind(listenfd,(struct sockaddr *)&servaddr,sizeof(servaddr));
      }

      listen(listenfd,1024);//backlog

      reactor react(epollfd,listenfd);
      //react.aof();
      react.reactor_listen(-1);

      close(epollfd);
}